

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O1

void __thiscall PcodeOp::PcodeOp(PcodeOp *this,int4 s,SeqNum *sq)

{
  pointer ppVVar1;
  ulong uVar2;
  allocator_type local_11;
  
  (this->start).pc.base = (sq->pc).base;
  (this->start).pc.offset = (sq->pc).offset;
  (this->start).uniq = sq->uniq;
  (this->basiciter)._M_node = (_List_node_base *)0x0;
  (this->insertiter)._M_node = (_List_node_base *)0x0;
  (this->codeiter)._M_node = (_List_node_base *)0x0;
  std::vector<Varnode_*,_std::allocator<Varnode_*>_>::vector(&this->inrefs,(long)s,&local_11);
  this->parent = (BlockBasic *)0x0;
  this->output = (Varnode *)0x0;
  this->opcode = (TypeOp *)0x0;
  this->flags = 0;
  this->addlflags = 0;
  ppVVar1 = (this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar1) {
    uVar2 = 0;
    do {
      ppVVar1[uVar2] = (Varnode *)0x0;
      uVar2 = uVar2 + 1;
      ppVVar1 = (this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->inrefs).
                                   super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                                   .super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3));
  }
  return;
}

Assistant:

PcodeOp::PcodeOp(int4 s,const SeqNum &sq) : start(sq),inrefs(s)

{
  flags = 0;			// Start out life as dead
  addlflags = 0;
  parent = (BlockBasic *)0; // No parent yet
  
  output = (Varnode *) 0;
  opcode = (TypeOp *)0;
  for(int4 i=0;i<inrefs.size();++i)
    inrefs[i] = (Varnode *)0;
}